

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O3

void __thiscall cnn::Device_CPU::Device_CPU(Device_CPU *this,int mb,bool shared)

{
  CPUAllocator *this_00;
  int iVar1;
  MemAllocator *pMVar2;
  float *pfVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AlignedMemoryPool *pAVar4;
  undefined7 in_register_00000011;
  size_t cap;
  
  this_00 = &this->cpu_mem;
  (this->super_Device).type = CPU;
  (this->super_Device).mem = &this_00->super_MemAllocator;
  (this->super_Device).name._M_dataplus._M_p = (pointer)&(this->super_Device).name.field_2;
  (this->super_Device).name._M_string_length = 0;
  (this->super_Device).name.field_2._M_local_buf[0] = '\0';
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__Device_CPU_00318ad8;
  (this->cpu_mem).super_MemAllocator.align = 0x20;
  (this->cpu_mem).super_MemAllocator._vptr_MemAllocator = (_func_int **)&PTR__MemAllocator_00318b80;
  this->shmem = &this_00->super_MemAllocator;
  if ((int)CONCAT71(in_register_00000011,shared) != 0) {
    pMVar2 = (MemAllocator *)operator_new(0x10);
    pMVar2->align = 0x20;
    pMVar2->_vptr_MemAllocator = (_func_int **)&PTR__MemAllocator_00318bd0;
    this->shmem = pMVar2;
  }
  pfVar3 = (float *)CPUAllocator::malloc(this_00,4);
  (this->super_Device).kSCALAR_MINUSONE = pfVar3;
  *pfVar3 = -1.0;
  pMVar2 = (this->super_Device).mem;
  iVar1 = (*pMVar2->_vptr_MemAllocator[2])(pMVar2,4);
  (this->super_Device).kSCALAR_ONE = (float *)CONCAT44(extraout_var,iVar1);
  *(float *)CONCAT44(extraout_var,iVar1) = 1.0;
  pMVar2 = (this->super_Device).mem;
  iVar1 = (*pMVar2->_vptr_MemAllocator[2])(pMVar2,4);
  (this->super_Device).kSCALAR_ZERO = (float *)CONCAT44(extraout_var_00,iVar1);
  *(float *)CONCAT44(extraout_var_00,iVar1) = 0.0;
  pAVar4 = (AlignedMemoryPool *)operator_new(0x28);
  cap = (long)mb << 0x14;
  pAVar4->a = (this->super_Device).mem;
  AlignedMemoryPool::sys_alloc(pAVar4,cap);
  (*pAVar4->a->_vptr_MemAllocator[4])(pAVar4->a,pAVar4->mem,pAVar4->capacity);
  (this->super_Device).fxs = pAVar4;
  pAVar4 = (AlignedMemoryPool *)operator_new(0x28);
  pAVar4->a = (this->super_Device).mem;
  AlignedMemoryPool::sys_alloc(pAVar4,cap);
  (*pAVar4->a->_vptr_MemAllocator[4])(pAVar4->a,pAVar4->mem,pAVar4->capacity);
  (this->super_Device).dEdfs = pAVar4;
  pAVar4 = (AlignedMemoryPool *)operator_new(0x28);
  pAVar4->a = (this->super_Device).mem;
  AlignedMemoryPool::sys_alloc(pAVar4,cap);
  (*pAVar4->a->_vptr_MemAllocator[4])(pAVar4->a,pAVar4->mem,pAVar4->capacity);
  (this->super_Device).ps = pAVar4;
  return;
}

Assistant:

Device_CPU::Device_CPU(int mb, bool shared) :
    Device(DeviceType::CPU, &cpu_mem), shmem(mem) {
  if (shared) shmem = new SharedAllocator();
  kSCALAR_MINUSONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ZERO = 0;

  // this is the big memory allocation: the pools
        
  size_t byte_count = (size_t)mb << 20;
  fxs = new AlignedMemoryPool(byte_count, mem); // memory for node values
  dEdfs = new AlignedMemoryPool(byte_count, mem); // memory for node gradients
  ps = new AlignedMemoryPool(byte_count, mem); // memory for parameters

}